

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void anon_unknown.dwarf_5292d::compute_BRIO_order_recursive
               (index_t nb_vertices,double *vertices,index_t dimension,index_t stride,
               vector<unsigned_int> *sorted_indices,iterator b,iterator e,index_t threshold,
               double ratio,index_t *depth,vector<unsigned_int> *levels)

{
  difference_type dVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  local_130;
  value_type_conflict local_128 [5];
  allocator local_111;
  string local_110 [32];
  uint *local_f0;
  uint *local_e8;
  HilbertSort2d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh> local_e0;
  uint *local_d8;
  uint *local_d0;
  HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh> local_c8;
  undefined1 local_78 [8];
  VertexMesh M;
  iterator local_50;
  iterator m;
  double ratio_local;
  vector<unsigned_int> *sorted_indices_local;
  index_t stride_local;
  index_t dimension_local;
  double *vertices_local;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  _Stack_20;
  index_t nb_vertices_local;
  iterator e_local;
  iterator b_local;
  
  _Stack_20._M_current = e._M_current;
  e_local = b;
  dVar1 = __gnu_cxx::operator-(&stack0xffffffffffffffe0,&e_local);
  local_50._M_current = b._M_current;
  if (threshold < (uint)dVar1) {
    *depth = *depth + 1;
    dVar1 = __gnu_cxx::operator-(&stack0xffffffffffffffe0,&e_local);
    local_50._M_current =
         (uint *)__gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                 ::operator+(&e_local,(long)(int)((double)dVar1 * ratio));
    M.vertices._8_8_ = local_50._M_current;
    compute_BRIO_order_recursive
              (nb_vertices,vertices,dimension,stride,sorted_indices,e_local,local_50,threshold,ratio
               ,depth,levels);
  }
  VertexMesh::VertexMesh((VertexMesh *)local_78,nb_vertices,vertices,stride);
  if (dimension == 3) {
    local_d0 = local_50._M_current;
    local_d8 = _Stack_20._M_current;
    HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh>::
    HilbertSort3d(&local_c8,(VertexMesh *)local_78,local_50,(iterator)_Stack_20._M_current,1);
  }
  else {
    if (dimension != 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_110,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                 ,&local_111);
      GEO::geo_should_not_have_reached((string *)local_110,0x23f4);
    }
    local_e8 = local_50._M_current;
    local_f0 = _Stack_20._M_current;
    HilbertSort2d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh>::
    HilbertSort2d(&local_e0,(VertexMesh *)local_78,local_50,(iterator)_Stack_20._M_current,1);
  }
  if (levels != (vector<unsigned_int> *)0x0) {
    local_130._M_current =
         (uint *)std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::begin
                           (&sorted_indices->
                             super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                           );
    dVar1 = __gnu_cxx::operator-(&stack0xffffffffffffffe0,&local_130);
    local_128[0] = (value_type_conflict)dVar1;
    std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::push_back
              (&levels->
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,
               local_128);
  }
  return;
}

Assistant:

void compute_BRIO_order_recursive(
        index_t nb_vertices, const double* vertices,
        index_t dimension, index_t stride,
        vector<index_t>& sorted_indices,
        vector<index_t>::iterator b,
        vector<index_t>::iterator e,
        index_t threshold,
        double ratio,
        index_t& depth,
        vector<index_t>* levels
    ) {
        geo_debug_assert(e > b);

        vector<index_t>::iterator m = b;
        if(index_t(e - b) > threshold) {
            ++depth;
            m = b + int(double(e - b) * ratio);
            compute_BRIO_order_recursive(
                nb_vertices, vertices,
		dimension, stride,
                sorted_indices, b, m,
                threshold, ratio, depth,
                levels
            );
        }

        VertexMesh M(nb_vertices, vertices, stride);
	if(dimension == 3) {
	    HilbertSort3d<Hilbert_vcmp, VertexMesh>(
		M, m, e
	    );
	} else if(dimension ==2) {
	    HilbertSort2d<Hilbert_vcmp, VertexMesh>(
		M, m, e
	    );
	} else {
	    geo_assert_not_reached;
	}

        if(levels != nullptr) {
            levels->push_back(index_t(e - sorted_indices.begin()));
        }
    }